

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# B3DImporter.cpp
# Opt level: O1

aiNode * __thiscall Assimp::B3DImporter::ReadNODE(B3DImporter *this,aiNode *parent)

{
  pointer *pppaVar1;
  iterator __position;
  pointer puVar2;
  pointer puVar3;
  pointer puVar4;
  void *pvVar5;
  int iVar6;
  aiNode *paVar7;
  uint *__dest;
  aiNode **__dest_00;
  uint uVar8;
  pointer __old_p;
  ulong uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  aiQuaternion aVar38;
  unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_> nodeAnim;
  aiNode *node;
  aiNode *child;
  vector<unsigned_int,_std::allocator<unsigned_int>_> meshes;
  vector<aiNode_*,_std::allocator<aiNode_*>_> children;
  string t;
  string name;
  _Head_base<0UL,_aiNodeAnim_*,_false> local_148;
  float local_140;
  float local_13c;
  aiNode *local_138;
  float local_12c;
  float local_128;
  float local_124;
  aiNode *local_120;
  void *local_118;
  iterator iStack_110;
  uint *local_108;
  void *local_f8;
  iterator iStack_f0;
  aiNode **local_e8;
  undefined1 local_d8 [16];
  undefined1 local_c8 [8];
  float fStack_c0;
  float fStack_bc;
  ulong local_b0;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  string local_88;
  string local_68;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  ReadString_abi_cxx11_(&local_68,this);
  fVar10 = ReadFloat(this);
  local_124 = ReadFloat(this);
  local_128 = ReadFloat(this);
  local_13c = ReadFloat(this);
  local_140 = ReadFloat(this);
  local_12c = ReadFloat(this);
  aVar38 = ReadQuat(this);
  local_d8._8_4_ = extraout_XMM0_Dc;
  local_d8._0_8_ = aVar38._0_8_;
  local_d8._12_4_ = extraout_XMM0_Dd;
  fStack_c0 = (float)in_XMM1_Dc;
  local_c8 = (undefined1  [8])aVar38._8_8_;
  fStack_bc = (float)in_XMM1_Dd;
  local_b0 = (long)(this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
  paVar7 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(paVar7,&local_68);
  __position._M_current =
       (this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_138 = paVar7;
  if (__position._M_current ==
      (this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiNode*,std::allocator<aiNode*>>::_M_realloc_insert<aiNode*const&>
              ((vector<aiNode*,std::allocator<aiNode*>> *)&this->_nodes,__position,&local_138);
  }
  else {
    *__position._M_current = paVar7;
    pppaVar1 = &(this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppaVar1 = *pppaVar1 + 1;
  }
  fVar13 = (float)local_c8._0_4_ * (float)local_c8._0_4_ +
           (float)local_c8._4_4_ * (float)local_c8._4_4_;
  fVar22 = 1.0 - (fVar13 + fVar13);
  fStack_94 = (float)local_d8._4_4_;
  fVar14 = (float)local_d8._4_4_ * (float)local_c8._0_4_ -
           (float)local_c8._4_4_ * (float)local_d8._0_4_;
  fVar18 = (float)local_c8._4_4_ * (float)local_d8._0_4_ +
           (float)local_d8._4_4_ * (float)local_c8._0_4_;
  fVar13 = (float)local_c8._4_4_ * (float)local_c8._4_4_ +
           (float)local_d8._4_4_ * (float)local_d8._4_4_;
  fVar28 = 1.0 - (fVar13 + fVar13);
  fVar27 = (float)local_d8._4_4_ * (float)local_c8._4_4_ +
           (float)local_d8._0_4_ * (float)local_c8._0_4_;
  fVar16 = (float)local_d8._4_4_ * (float)local_c8._4_4_ -
           (float)local_d8._0_4_ * (float)local_c8._0_4_;
  fVar31 = (float)local_c8._4_4_ * (float)local_c8._0_4_ -
           (float)local_d8._4_4_ * (float)local_d8._0_4_;
  fVar20 = (float)local_d8._4_4_ * (float)local_d8._0_4_ +
           (float)local_c8._4_4_ * (float)local_c8._0_4_;
  fVar13 = (float)local_d8._4_4_ * (float)local_d8._4_4_ +
           (float)local_c8._0_4_ * (float)local_c8._0_4_;
  fVar15 = 1.0 - (fVar13 + fVar13);
  fVar14 = fVar14 + fVar14;
  fVar27 = fVar27 + fVar27;
  fVar18 = fVar18 + fVar18;
  fVar31 = fVar31 + fVar31;
  fVar16 = fVar16 + fVar16;
  fVar20 = fVar20 + fVar20;
  local_48 = fVar18 * 0.0;
  fStack_44 = (float)local_c8._4_4_;
  fStack_40 = (float)local_c8._4_4_;
  fStack_3c = (float)local_c8._4_4_;
  fVar13 = fVar16 * 0.0;
  fStack_90 = fStack_94;
  fStack_8c = fStack_94;
  fVar11 = fVar10 * 0.0;
  fVar25 = fVar22 + local_48 + fVar13 + fVar11;
  fVar33 = fVar28 * 0.0;
  local_c8._0_4_ = fVar20 * 0.0;
  fStack_a4 = fStack_94;
  fStack_a0 = fStack_94;
  fStack_9c = fStack_94;
  fVar35 = fVar14 + fVar33 + (float)local_c8._0_4_ + fVar11;
  fVar17 = fVar31 * 0.0;
  fVar37 = fVar15 * 0.0;
  fVar11 = fVar27 + fVar17 + fVar37 + fVar11;
  fVar22 = fVar22 * 0.0;
  fVar12 = local_124 * 0.0;
  fVar19 = fVar18 + fVar22 + fVar13 + fVar12;
  fVar14 = fVar14 * 0.0;
  fVar29 = fVar28 + fVar14 + (float)local_c8._0_4_ + fVar12;
  fVar27 = fVar27 * 0.0;
  fVar12 = fVar31 + fVar27 + fVar37 + fVar12;
  fVar22 = fVar22 + local_48;
  fVar14 = fVar14 + fVar33;
  fVar27 = fVar27 + fVar17;
  local_d8._0_4_ = local_128 * 0.0;
  fVar18 = fVar16 + fVar22 + (float)local_d8._0_4_;
  fVar21 = fVar20 + fVar14 + (float)local_d8._0_4_;
  local_d8._0_4_ = fVar15 + fVar27 + (float)local_d8._0_4_;
  local_c8._0_4_ = fVar14 + (float)local_c8._0_4_;
  local_c8._4_4_ = fStack_94;
  fStack_c0 = fStack_94;
  fStack_bc = fStack_94;
  fVar36 = fVar35 * 0.0;
  fVar14 = fVar25 * 0.0;
  fVar26 = fVar14 + fVar36;
  fVar17 = fVar11 * 0.0;
  fVar15 = (fVar10 + 0.0) * 0.0;
  local_98 = local_140 * fVar35 + fVar14 + fVar17 + fVar15;
  local_a8 = local_12c * fVar11 + fVar26 + fVar15;
  fVar30 = fVar29 * 0.0;
  fVar31 = fVar19 * 0.0;
  fVar33 = fVar31 + fVar30;
  fVar32 = fVar12 * 0.0;
  fVar11 = (local_124 + 0.0) * 0.0;
  fVar35 = fVar21 * 0.0;
  fVar20 = fVar18 * 0.0;
  fVar28 = fVar20 + fVar35;
  fVar16 = (float)local_d8._0_4_ * 0.0;
  fVar34 = (local_128 + 0.0) * 0.0;
  fVar22 = fVar22 + fVar13 + 0.0;
  fVar13 = (float)local_c8._0_4_ + 0.0;
  fVar14 = fVar13 * 0.0;
  fVar23 = fVar22 * 0.0;
  fVar24 = fVar23 + fVar14;
  fVar27 = fVar27 + fVar37 + 0.0;
  fVar37 = fVar27 * 0.0;
  local_138->mParent = parent;
  (local_138->mTransformation).a1 = local_13c * fVar25 + fVar36 + fVar17 + fVar15;
  (local_138->mTransformation).a2 = local_98;
  (local_138->mTransformation).a3 = local_a8;
  (local_138->mTransformation).a4 = fVar26 + fVar17 + fVar10 + 0.0;
  (local_138->mTransformation).b1 = local_13c * fVar19 + fVar30 + fVar32 + fVar11;
  (local_138->mTransformation).b2 = local_140 * fVar29 + fVar31 + fVar32 + fVar11;
  (local_138->mTransformation).b3 = local_12c * fVar12 + fVar33 + fVar11;
  (local_138->mTransformation).b4 = fVar33 + fVar32 + local_124 + 0.0;
  (local_138->mTransformation).c1 = local_13c * fVar18 + fVar35 + fVar16 + fVar34;
  (local_138->mTransformation).c2 = local_140 * fVar21 + fVar20 + fVar16 + fVar34;
  (local_138->mTransformation).c3 = local_12c * (float)local_d8._0_4_ + fVar28 + fVar34;
  (local_138->mTransformation).c4 = fVar28 + fVar16 + local_128 + 0.0;
  (local_138->mTransformation).d1 = local_13c * fVar22 + fVar14 + fVar37 + 0.0;
  (local_138->mTransformation).d2 = local_140 * fVar13 + fVar23 + fVar37 + 0.0;
  (local_138->mTransformation).d3 = local_12c * fVar27 + fVar24 + 0.0;
  (local_138->mTransformation).d4 = fVar24 + fVar37 + 1.0;
  local_148._M_head_impl = (aiNodeAnim *)0x0;
  local_108 = (uint *)0x0;
  local_118 = (void *)0x0;
  iStack_110._M_current = (uint *)0x0;
  local_e8 = (aiNode **)0x0;
  local_f8 = (void *)0x0;
  iStack_f0._M_current = (aiNode **)0x0;
  if ((this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish[-1] != this->_pos) {
    local_b0 = local_b0 >> 3;
    do {
      ReadChunk_abi_cxx11_(&local_88,this);
      iVar6 = std::__cxx11::string::compare((char *)&local_88);
      if (iVar6 == 0) {
        puVar2 = (this->_meshes).
                 super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar3 = (this->_meshes).
                 super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        ReadMESH(this);
        uVar9 = (ulong)((long)puVar3 - (long)puVar2) >> 3;
        while( true ) {
          uVar8 = (uint)uVar9;
          local_120 = (aiNode *)CONCAT44(local_120._4_4_,uVar8);
          if ((uint)((ulong)((long)(this->_meshes).
                                   super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->_meshes).
                                  super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) <= uVar8) break;
          if (iStack_110._M_current == local_108) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_118,iStack_110,
                       (uint *)&local_120);
          }
          else {
            *iStack_110._M_current = uVar8;
            iStack_110._M_current = iStack_110._M_current + 1;
          }
          uVar9 = (ulong)((int)local_120 + 1);
        }
      }
      else {
        iVar6 = std::__cxx11::string::compare((char *)&local_88);
        if (iVar6 == 0) {
          ReadBONE(this,(int)local_b0);
        }
        else {
          iVar6 = std::__cxx11::string::compare((char *)&local_88);
          if (iVar6 == 0) {
            ReadANIM(this);
          }
          else {
            iVar6 = std::__cxx11::string::compare((char *)&local_88);
            if (iVar6 == 0) {
              if ((aiNode *)local_148._M_head_impl == (aiNode *)0x0) {
                paVar7 = (aiNode *)operator_new(0x438);
                (paVar7->mName).length = 0;
                (paVar7->mName).data[0] = '\0';
                memset((paVar7->mName).data + 1,0x1b,0x3ff);
                (paVar7->mTransformation).b2 = 0.0;
                (paVar7->mTransformation).b3 = 0.0;
                (paVar7->mTransformation).b4 = 0.0;
                (paVar7->mTransformation).a1 = 0.0;
                (paVar7->mTransformation).a2 = 0.0;
                (paVar7->mTransformation).a3 = 0.0;
                (paVar7->mTransformation).a4 = 0.0;
                (paVar7->mTransformation).c2 = 0.0;
                (paVar7->mTransformation).c3 = 0.0;
                (paVar7->mTransformation).c4 = 0.0;
                (paVar7->mTransformation).d1 = 0.0;
                local_148._M_head_impl = (aiNodeAnim *)paVar7;
                if (paVar7 != local_138) {
                  uVar8 = (local_138->mName).length;
                  (paVar7->mName).length = uVar8;
                  memcpy((paVar7->mName).data,(local_138->mName).data,(ulong)uVar8);
                  (paVar7->mName).data[uVar8] = '\0';
                }
              }
              ReadKEYS(this,local_148._M_head_impl);
            }
            else {
              iVar6 = std::__cxx11::string::compare((char *)&local_88);
              if (iVar6 == 0) {
                local_120 = ReadNODE(this,local_138);
                if (iStack_f0._M_current == local_e8) {
                  std::vector<aiNode*,std::allocator<aiNode*>>::_M_realloc_insert<aiNode*const&>
                            ((vector<aiNode*,std::allocator<aiNode*>> *)&local_f8,iStack_f0,
                             &local_120);
                }
                else {
                  *iStack_f0._M_current = local_120;
                  iStack_f0._M_current = iStack_f0._M_current + 1;
                }
              }
            }
          }
        }
      }
      puVar4 = (this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      this->_pos = puVar4[-1];
      (this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar4 + -1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
    } while ((this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish[-1] != this->_pos);
  }
  if ((aiNode *)local_148._M_head_impl != (aiNode *)0x0) {
    std::
    vector<std::unique_ptr<aiNodeAnim,std::default_delete<aiNodeAnim>>,std::allocator<std::unique_ptr<aiNodeAnim,std::default_delete<aiNodeAnim>>>>
    ::emplace_back<std::unique_ptr<aiNodeAnim,std::default_delete<aiNodeAnim>>>
              ((vector<std::unique_ptr<aiNodeAnim,std::default_delete<aiNodeAnim>>,std::allocator<std::unique_ptr<aiNodeAnim,std::default_delete<aiNodeAnim>>>>
                *)&this->_nodeAnims,
               (unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_> *)&local_148);
  }
  pvVar5 = local_118;
  paVar7 = local_138;
  uVar9 = (long)iStack_110._M_current - (long)local_118 >> 2;
  local_138->mNumMeshes = (uint)uVar9;
  if ((long)iStack_110._M_current - (long)local_118 == 0) {
    __dest = (uint *)0x0;
  }
  else {
    __dest = (uint *)operator_new__(-(ulong)(uVar9 >> 0x3e != 0) |
                                    (long)iStack_110._M_current - (long)local_118);
    memcpy(__dest,pvVar5,(uVar9 + (uVar9 == 0)) * 4);
  }
  pvVar5 = local_f8;
  paVar7->mMeshes = __dest;
  uVar9 = (long)iStack_f0._M_current - (long)local_f8 >> 3;
  paVar7->mNumChildren = (uint)uVar9;
  if ((long)iStack_f0._M_current - (long)local_f8 == 0) {
    __dest_00 = (aiNode **)0x0;
  }
  else {
    __dest_00 = (aiNode **)
                operator_new__(-(ulong)(uVar9 >> 0x3d != 0) |
                               (long)iStack_f0._M_current - (long)local_f8);
    memcpy(__dest_00,pvVar5,(uVar9 + (uVar9 == 0)) * 8);
  }
  paVar7->mChildren = __dest_00;
  if (pvVar5 != (void *)0x0) {
    operator_delete(pvVar5,(long)local_e8 - (long)pvVar5);
  }
  if (local_118 != (void *)0x0) {
    operator_delete(local_118,(long)local_108 - (long)local_118);
  }
  std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::~unique_ptr
            ((unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_> *)&local_148);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return paVar7;
}

Assistant:

aiNode *B3DImporter::ReadNODE( aiNode *parent ){

    string name=ReadString();
    aiVector3D t=ReadVec3();
    aiVector3D s=ReadVec3();
    aiQuaternion r=ReadQuat();

    aiMatrix4x4 trans,scale,rot;

    aiMatrix4x4::Translation( t,trans );
    aiMatrix4x4::Scaling( s,scale );
    rot=aiMatrix4x4( r.GetMatrix() );

    aiMatrix4x4 tform=trans * rot * scale;

    int nodeid=static_cast<int>(_nodes.size());

    aiNode *node=new aiNode( name );
    _nodes.push_back( node );

    node->mParent=parent;
    node->mTransformation=tform;

    std::unique_ptr<aiNodeAnim> nodeAnim;
    vector<unsigned> meshes;
    vector<aiNode*> children;

    while( ChunkSize() ){
        string t=ReadChunk();
        if( t=="MESH" ){
            unsigned int n= static_cast<unsigned int>(_meshes.size());
            ReadMESH();
            for( unsigned int i=n;i<static_cast<unsigned int>(_meshes.size());++i ){
                meshes.push_back( i );
            }
        }else if( t=="BONE" ){
            ReadBONE( nodeid );
        }else if( t=="ANIM" ){
            ReadANIM();
        }else if( t=="KEYS" ){
            if( !nodeAnim ){
                nodeAnim.reset(new aiNodeAnim);
                nodeAnim->mNodeName=node->mName;
            }
            ReadKEYS( nodeAnim.get() );
        }else if( t=="NODE" ){
            aiNode *child=ReadNODE( node );
            children.push_back( child );
        }
        ExitChunk();
    }

    if (nodeAnim) {
        _nodeAnims.emplace_back( std::move(nodeAnim) );
    }

    node->mNumMeshes= static_cast<unsigned int>(meshes.size());
    node->mMeshes=to_array( meshes );

    node->mNumChildren=static_cast<unsigned int>(children.size());
    node->mChildren=to_array( children );

    return node;
}